

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tx_search.c
# Opt level: O2

int64_t av1_pixel_diff_dist(MACROBLOCK *x,int plane,int blk_row,int blk_col,BLOCK_SIZE plane_bsize,
                           BLOCK_SIZE tx_bsize,uint *block_mse_q8)

{
  uint uVar1;
  uint64_t uVar2;
  undefined7 in_register_00000081;
  int visible_rows;
  int visible_cols;
  
  get_txb_dimensions(&x->e_mbd,plane,plane_bsize,blk_row,blk_col,tx_bsize,(int *)0x0,(int *)0x0,
                     &visible_cols,&visible_rows);
  uVar2 = (*aom_sum_squares_2d_i16)
                    (x->plane[plane].src_diff +
                     (int)((blk_row * (uint)block_size_wide
                                            [CONCAT71(in_register_00000081,plane_bsize) & 0xffffffff
                                            ] + blk_col) * 4),
                     (int)block_size_wide[CONCAT71(in_register_00000081,plane_bsize) & 0xffffffff],
                     visible_cols,visible_rows);
  if (block_mse_q8 != (uint *)0x0) {
    if (visible_rows < 1 || visible_cols < 1) {
      uVar1 = 0xffffffff;
    }
    else {
      uVar1 = (uint)((uVar2 << 8) / (ulong)(uint)(visible_rows * visible_cols));
    }
    *block_mse_q8 = uVar1;
  }
  return uVar2;
}

Assistant:

int64_t av1_pixel_diff_dist(const MACROBLOCK *x, int plane, int blk_row,
                            int blk_col, const BLOCK_SIZE plane_bsize,
                            const BLOCK_SIZE tx_bsize,
                            unsigned int *block_mse_q8) {
  int visible_rows, visible_cols;
  const MACROBLOCKD *xd = &x->e_mbd;
  get_txb_dimensions(xd, plane, plane_bsize, blk_row, blk_col, tx_bsize, NULL,
                     NULL, &visible_cols, &visible_rows);
  const int diff_stride = block_size_wide[plane_bsize];
  const int16_t *diff = x->plane[plane].src_diff;

  diff += ((blk_row * diff_stride + blk_col) << MI_SIZE_LOG2);
  uint64_t sse =
      aom_sum_squares_2d_i16(diff, diff_stride, visible_cols, visible_rows);
  if (block_mse_q8 != NULL) {
    if (visible_cols > 0 && visible_rows > 0)
      *block_mse_q8 =
          (unsigned int)((256 * sse) / (visible_cols * visible_rows));
    else
      *block_mse_q8 = UINT_MAX;
  }
  return sse;
}